

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

QRect __thiscall QTreeViewPrivate::itemDecorationRect(QTreeViewPrivate *this,QModelIndex *index)

{
  QWidget *this_00;
  QAbstractItemModel *pQVar1;
  QHeaderView *pQVar2;
  char cVar3;
  bool bVar4;
  uint item;
  int iVar5;
  int iVar6;
  LayoutDirection LVar7;
  int iVar8;
  QStyle *pQVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  QRect QVar16;
  undefined1 local_78 [8];
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = 0xffffffff00000000;
  uVar13 = 0xffffffff;
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  if (this->rootDecoration == false) {
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_78 = (undefined1  [8])0xffffffffffffffff;
      puStack_70 = (undefined1 *)0x0;
      local_68.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x68))(local_78,pQVar1,index);
    }
    cVar3 = comparesEqual(&(this->super_QAbstractItemViewPrivate).root,(QModelIndex *)local_78);
    if (cVar3 == '\0') goto LAB_005b4d9f;
  }
  else {
LAB_005b4d9f:
    item = viewIndex(this,index);
    if (-1 < (int)item) {
      uVar10 = (ulong)item;
      bVar4 = hasVisibleChildren(this,&(this->viewItems).d.ptr[uVar10].index);
      uVar12 = 0;
      iVar11 = 0;
      if (bVar4) {
        if (uVar10 < (ulong)(this->viewItems).d.size) {
          iVar11 = ((uint)this->rootDecoration +
                   (uint)*(ushort *)&(this->viewItems).d.ptr[uVar10].field_0x20) * this->indent;
        }
        pQVar2 = this->header;
        iVar5 = this->treePosition;
        if (iVar5 < 0) {
          iVar5 = QHeaderView::logicalIndex(pQVar2,0);
        }
        iVar6 = QHeaderView::sectionViewportPosition(pQVar2,iVar5);
        pQVar2 = this->header;
        iVar5 = this->treePosition;
        if (iVar5 < 0) {
          iVar5 = QHeaderView::logicalIndex(pQVar2,0);
        }
        iVar5 = QHeaderView::sectionSize(pQVar2,iVar5);
        LVar7 = QWidget::layoutDirection(this_00);
        if (LVar7 == RightToLeft) {
          iVar5 = (iVar6 - iVar11) + iVar5;
        }
        else {
          iVar5 = (iVar6 + iVar11) - this->indent;
        }
        iVar6 = coordinateForItem(this,item);
        iVar11 = this->indent;
        iVar8 = itemHeight(this,item);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
        QStyleOption::initFrom((QStyleOption *)local_78,this_00);
        local_68.ptr._4_4_ = iVar6;
        local_68.ptr._0_4_ = iVar5;
        uStack_60._4_4_ = iVar6 + -1 + iVar8;
        uStack_60._0_4_ = iVar11 + iVar5 + -1;
        pQVar9 = QWidget::style(this_00);
        auVar15 = (**(code **)(*(long *)pQVar9 + 0xc0))
                            (pQVar9,0x19,(QStyleOption *)local_78,this_00);
        uVar14 = auVar15._0_8_ & 0xffffffff00000000;
        uVar10 = auVar15._8_8_ & 0xffffffff00000000;
        QStyleOption::~QStyleOption((QStyleOption *)local_78);
        uVar12 = auVar15._0_8_ & 0xffffffff;
        uVar13 = auVar15._8_8_ & 0xffffffff;
      }
      else {
        uVar14 = 0;
        uVar10 = 0xffffffff00000000;
      }
      goto LAB_005b4f57;
    }
  }
  uVar12 = 0;
  uVar14 = 0;
LAB_005b4f57:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar16.x2.m_i = (int)(uVar10 | uVar13);
    QVar16.y2.m_i = (int)((uVar10 | uVar13) >> 0x20);
    QVar16.x1.m_i = (int)(uVar14 | uVar12);
    QVar16.y1.m_i = (int)((uVar14 | uVar12) >> 0x20);
    return QVar16;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTreeViewPrivate::itemDecorationRect(const QModelIndex &index) const
{
    Q_Q(const QTreeView);
    if (!rootDecoration && index.parent() == root)
        return QRect(); // no decoration at root

    int viewItemIndex = viewIndex(index);
    if (viewItemIndex < 0 || !hasVisibleChildren(viewItems.at(viewItemIndex).index))
        return QRect();

    int itemIndentation = indentationForItem(viewItemIndex);
    int position = header->sectionViewportPosition(logicalIndexForTree());
    int size = header->sectionSize(logicalIndexForTree());

    QRect rect;
    if (q->isRightToLeft())
        rect = QRect(position + size - itemIndentation, coordinateForItem(viewItemIndex),
                     indent, itemHeight(viewItemIndex));
    else
        rect = QRect(position + itemIndentation - indent, coordinateForItem(viewItemIndex),
                     indent, itemHeight(viewItemIndex));
    QStyleOption opt;
    opt.initFrom(q);
    opt.rect = rect;
    return q->style()->subElementRect(QStyle::SE_TreeViewDisclosureItem, &opt, q);
}